

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOEffect.cpp
# Opt level: O3

KBOOL __thiscall KDIS::DATA_TYPE::IOEffect::operator==(IOEffect *this,IOEffect *Value)

{
  KBOOL KVar1;
  
  KVar1 = StandardVariable::operator!=(&this->super_StandardVariable,&Value->super_StandardVariable)
  ;
  if ((((KVar1) ||
       ((this->super_StandardVariable).field_0xe != (Value->super_StandardVariable).field_0xe)) ||
      ((this->super_StandardVariable).field_0xf != (Value->super_StandardVariable).field_0xf)) ||
     (((this->m_ui8Eff != Value->m_ui8Eff || (this->m_ui8EffDtyCyc != Value->m_ui8EffDtyCyc)) ||
      (this->m_ui16EffDur != Value->m_ui16EffDur)))) {
    KVar1 = false;
  }
  else {
    KVar1 = this->m_ui16Proc == Value->m_ui16Proc;
  }
  return KVar1;
}

Assistant:

KBOOL IOEffect::operator == ( const IOEffect & Value ) const
{
    if( StandardVariable::operator  !=( Value ) )               return false;
    if( m_ui8Status                 != Value.m_ui8Status )      return false;
    if( m_ui8LnkTyp                 != Value.m_ui8LnkTyp )      return false;
    if( m_ui8Eff                    != Value.m_ui8Eff )         return false;
    if( m_ui8EffDtyCyc              != Value.m_ui8EffDtyCyc )   return false;
    if( m_ui16EffDur                != Value.m_ui16EffDur )     return false;
    if( m_ui16Proc                  != Value.m_ui16Proc )       return false;
    return true;
}